

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetEncryptionConfig::ParquetEncryptionConfig
          (ParquetEncryptionConfig *this,ClientContext *context,Value *arg)

{
  pointer pcVar1;
  int iVar2;
  ParquetKeys *pPVar3;
  idx_t iVar4;
  const_reference str;
  const_reference pvVar5;
  string *psVar6;
  const_iterator cVar7;
  NotImplementedException *this_00;
  BinderException *pBVar8;
  ulong __n;
  string footer_key_name;
  Value local_118;
  ParquetEncryptionConfig *local_d8;
  ClientContext *local_d0;
  vector<duckdb::Value,_true> *local_c8;
  key_type local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_a0;
  child_list_t<LogicalType> *local_98;
  Value *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  LogicalType local_48;
  
  (this->footer_key)._M_dataplus._M_p = (pointer)&(this->footer_key).field_2;
  (this->footer_key)._M_string_length = 0;
  (this->footer_key).field_2._M_local_buf[0] = '\0';
  (this->column_keys)._M_h._M_buckets = &(this->column_keys)._M_h._M_single_bucket;
  (this->column_keys)._M_h._M_bucket_count = 1;
  (this->column_keys)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->column_keys)._M_h._M_element_count = 0;
  (this->column_keys)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->column_keys)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->column_keys)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_d8 = this;
  local_d0 = context;
  if ((arg->type_).id_ != STRUCT) {
    pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
    local_118.type_._0_8_ = (long)&local_118 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"Parquet encryption_config must be of type STRUCT","");
    BinderException::BinderException(pBVar8,(string *)&local_118);
    __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_98 = StructType::GetChildTypes_abi_cxx11_(&arg->type_);
  local_c8 = StructValue::GetChildren(arg);
  local_90 = arg;
  pPVar3 = ParquetKeys::Get(local_d0);
  local_a0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&pPVar3->keys;
  __n = 0;
  do {
    iVar4 = StructType::GetChildCount(&local_90->type_);
    if (iVar4 <= __n) {
      return;
    }
    str = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::operator[](local_98,__n);
    StringUtil::Lower((string *)&local_118,&str->first);
    iVar2 = ::std::__cxx11::string::compare((char *)&local_118);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_118.type_._0_8_ !=
        (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_118 + 0x10U)) {
      operator_delete((void *)local_118.type_._0_8_);
    }
    if (iVar2 == 0) {
      pvVar5 = vector<duckdb::Value,_true>::operator[](local_c8,__n);
      LogicalType::LogicalType(&local_48,VARCHAR);
      Value::DefaultCastAs(&local_118,pvVar5,&local_48,false);
      psVar6 = StringValue::Get_abi_cxx11_(&local_118);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar1,pcVar1 + psVar6->_M_string_length);
      Value::~Value(&local_118);
      LogicalType::~LogicalType(&local_48);
      cVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_a0,&local_c0);
      if (cVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118.type_._0_8_ = (long)&local_118 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key(\'<key_name>\',\'<key>\');"
                   ,"");
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,local_c0._M_dataplus._M_p,
                   local_c0._M_dataplus._M_p + local_c0._M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar8,(string *)&local_118,&local_68);
        __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar3 = ParquetKeys::Get(local_d0);
      cVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pPVar3->keys,&local_c0);
      if (cVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        ::std::__throw_out_of_range("_Map_base::at");
      }
      ::std::__cxx11::string::_M_assign((string *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
    }
    else {
      StringUtil::Lower((string *)&local_118,&str->first);
      iVar2 = ::std::__cxx11::string::compare((char *)&local_118);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_118.type_._0_8_ !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_118 + 0x10U)) {
        operator_delete((void *)local_118.type_._0_8_);
      }
      if (iVar2 != 0) {
        StringUtil::Lower((string *)&local_118,&str->first);
        iVar2 = ::std::__cxx11::string::compare((char *)&local_118);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_118.type_._0_8_ !=
            (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_118 + 0x10U)) {
          operator_delete((void *)local_118.type_._0_8_);
        }
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_118.type_._0_8_ = (long)&local_118 + 0x10;
        if (iVar2 == 0) {
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "Parquet encryption_config column_keys not yet implemented","");
          NotImplementedException::NotImplementedException(this_00,(string *)&local_118);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"Unknown key in encryption_config \"%s\"","");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        pcVar1 = (str->first)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar1,pcVar1 + (str->first)._M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  ((BinderException *)this_00,(string *)&local_118,&local_88);
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar5 = vector<duckdb::Value,_true>::operator[](local_c8,__n);
      LogicalType::LogicalType((LogicalType *)&local_c0,BLOB);
      Value::DefaultCastAs(&local_118,pvVar5,(LogicalType *)&local_c0,false);
      StringValue::Get_abi_cxx11_(&local_118);
      ::std::__cxx11::string::_M_assign((string *)local_d8);
      Value::~Value(&local_118);
      LogicalType::~LogicalType((LogicalType *)&local_c0);
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

ParquetEncryptionConfig::ParquetEncryptionConfig(ClientContext &context, const Value &arg) {
	if (arg.type().id() != LogicalTypeId::STRUCT) {
		throw BinderException("Parquet encryption_config must be of type STRUCT");
	}
	const auto &child_types = StructType::GetChildTypes(arg.type());
	auto &children = StructValue::GetChildren(arg);
	const auto &keys = ParquetKeys::Get(context);
	for (idx_t i = 0; i < StructType::GetChildCount(arg.type()); i++) {
		auto &struct_key = child_types[i].first;
		if (StringUtil::Lower(struct_key) == "footer_key") {
			const auto footer_key_name = StringValue::Get(children[i].DefaultCastAs(LogicalType::VARCHAR));
			if (!keys.HasKey(footer_key_name)) {
				throw BinderException(
				    "No key with name \"%s\" exists. Add it with PRAGMA add_parquet_key('<key_name>','<key>');",
				    footer_key_name);
			}
			// footer key name provided - read the key from the config
			const auto &keys = ParquetKeys::Get(context);
			footer_key = keys.GetKey(footer_key_name);
		} else if (StringUtil::Lower(struct_key) == "footer_key_value") {
			footer_key = StringValue::Get(children[i].DefaultCastAs(LogicalType::BLOB));
		} else if (StringUtil::Lower(struct_key) == "column_keys") {
			throw NotImplementedException("Parquet encryption_config column_keys not yet implemented");
		} else {
			throw BinderException("Unknown key in encryption_config \"%s\"", struct_key);
		}
	}
}